

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall
mjs::literal_expression::literal_expression(literal_expression *this,source_extend *extend,token *t)

{
  bool bVar1;
  token_type tt;
  token *t_local;
  source_extend *extend_local;
  literal_expression *this_local;
  
  expression::syntax_node(&this->super_expression,extend);
  (this->super_expression).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__literal_expression_00292a60;
  token::token(&this->t_,t);
  tt = token::type(t);
  bVar1 = is_literal(tt);
  if (!bVar1) {
    __assert_fail("is_literal(t.type())",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                  0xc0,
                  "mjs::literal_expression::literal_expression(const source_extend &, const token &)"
                 );
  }
  return;
}

Assistant:

explicit literal_expression(const source_extend& extend, const token& t) : expression(extend), t_(t) {
        assert(is_literal(t.type()));
    }